

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandXsim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  uint fVerbose;
  int iVar3;
  uint fXState;
  char *pcVar4;
  uint fXInputs;
  uint local_40;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fXInputs = 0;
  Extra_UtilGetoptReset();
  local_40 = 10;
  fXState = 0;
  fVerbose = 0;
  while( true ) {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"Fisvh"), iVar3 = globalUtilOptind, iVar1 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 < 0x69) break;
      if (iVar1 == 0x69) {
        fXInputs = fXInputs ^ 1;
      }
      else {
        if (iVar1 != 0x73) goto LAB_0021974d;
        fXState = fXState ^ 1;
      }
    }
    if (iVar1 == -1) {
      if (pNtk == (Abc_Ntk_t *)0x0) {
        pcVar2 = "Empty network.\n";
      }
      else {
        if (pNtk->ntkType == ABC_NTK_STRASH) {
          if (pNtk->nObjCounts[8] != 0) {
            Abc_NtkXValueSimulate(pNtk,local_40,fXInputs,fXState,fVerbose);
            return 0;
          }
          Abc_Print(-1,"The network is combinational.\n");
          return 0;
        }
        pcVar2 = "Only works for strashed networks.\n";
      }
      iVar3 = -1;
      goto LAB_002197fa;
    }
    if (iVar1 != 0x46) goto LAB_0021974d;
    if (argc <= globalUtilOptind) break;
    local_40 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if ((int)local_40 < 0) {
LAB_0021974d:
      Abc_Print(-2,"usage: xsim [-F num] [-isvh]\n");
      Abc_Print(-2,"\t         performs X-valued simulation of the AIG\n");
      Abc_Print(-2,"\t-F num : the number of frames to simulate [default = %d]\n",(ulong)local_40);
      pcVar4 = "yes";
      pcVar2 = "yes";
      if (fXInputs == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,"\t-i     : toggle X-valued representation of inputs [default = %s]\n",pcVar2);
      pcVar2 = "yes";
      if (fXState == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle X-valued representation of state [default = %s]\n",pcVar2);
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      pcVar2 = "\t-h     : print the command usage\n";
      iVar3 = -2;
LAB_002197fa:
      Abc_Print(iVar3,pcVar2);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
  goto LAB_0021974d;
}

Assistant:

int Abc_CommandXsim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int nFrames;
    int fXInputs;
    int fXState;
    int fVerbose;
    extern void Abc_NtkXValueSimulate( Abc_Ntk_t * pNtk, int nFrames, int fXInputs, int fXState, int fVerbose );
    // set defaults
    nFrames    = 10;
    fXInputs   =  0;
    fXState    =  0;
    fVerbose   =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fisvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'i':
            fXInputs ^= 1;
            break;
        case 's':
            fXState ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for strashed networks.\n" );
        return 1;
    }
    if ( !Abc_NtkLatchNum(pNtk) )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    Abc_NtkXValueSimulate( pNtk, nFrames, fXInputs, fXState, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: xsim [-F num] [-isvh]\n" );
    Abc_Print( -2, "\t         performs X-valued simulation of the AIG\n" );
    Abc_Print( -2, "\t-F num : the number of frames to simulate [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-i     : toggle X-valued representation of inputs [default = %s]\n", fXInputs? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle X-valued representation of state [default = %s]\n", fXState? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}